

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
::
copy_or_move_from<google::dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>const&>
          (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           *this,dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                 *ht,size_type min_buckets_wanted)

{
  size_type sVar1;
  pointer ppVar2;
  pair<const_int,_int> *value;
  size_type new_num_buckets;
  pointer ppVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)this,
                   ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::clear_to_size((dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)this,new_num_buckets);
  sVar1 = ht->num_buckets;
  ppVar2 = ht->table;
  ppVar3 = ppVar2;
  if (sVar1 == 0) {
LAB_00617c1f:
    ppVar2 = ppVar2 + sVar1;
LAB_00617c23:
    if (ppVar3 != ppVar2) {
      lVar5 = *(long *)(this + 0x48);
      uVar4 = (long)ppVar3->first & *(long *)(this + 0x38) - 1U;
      if (*(int *)(this + 0x24) != *(int *)(lVar5 + uVar4 * 8)) {
        lVar6 = 1;
        do {
          uVar4 = uVar4 + lVar6 & *(long *)(this + 0x38) - 1U;
          lVar6 = lVar6 + 1;
        } while (*(int *)(this + 0x24) != *(int *)(lVar5 + uVar4 * 8));
      }
      *(pair<const_int,_int> *)(lVar5 + uVar4 * 8) = *ppVar3;
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
      ppVar3 = ppVar3 + 1;
      if (ppVar3 != ppVar2) {
        do {
          if (((ht->key_info).empty_key != ppVar3->first) &&
             (ht->num_deleted == 0 || (ht->key_info).delkey != ppVar3->first)) break;
          ppVar3 = ppVar3 + 1;
        } while (ppVar3 != ppVar2);
      }
      goto LAB_00617c23;
    }
  }
  else {
    lVar5 = sVar1 * 8;
    do {
      if (((ht->key_info).empty_key != ppVar3->first) &&
         (ht->num_deleted == 0 || (ht->key_info).delkey != ppVar3->first)) goto LAB_00617c1f;
      ppVar3 = ppVar3 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }